

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

int qpdf_oh_get_int_value_as_int(qpdf_data qpdf,qpdf_oh oh)

{
  int iVar1;
  anon_class_1_0_00000001 local_61;
  function<int_(QPDFObjectHandle_&)> local_60;
  int local_3c;
  function<int_()> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_3c = 0;
  local_14 = oh;
  p_Stack_10 = qpdf;
  return_T<int>(&local_38,&local_3c);
  std::function<int(QPDFObjectHandle&)>::function<qpdf_oh_get_int_value_as_int::__0,void>
            ((function<int(QPDFObjectHandle&)> *)&local_60,&local_61);
  iVar1 = do_with_oh<int>(qpdf,oh,&local_38,&local_60);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<int_()>::~function(&local_38);
  return iVar1;
}

Assistant:

int
qpdf_oh_get_int_value_as_int(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<int>(qpdf, oh, return_T<int>(0), [](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_int_value_as_int");
        return o.getIntValueAsInt();
    });
}